

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pettyprof.h
# Opt level: O2

void pepro::impl::ProfileStack::pop(void)

{
  ProfileStack *this;
  long lVar1;
  ProfileStack *pPVar2;
  ostream *poVar3;
  _Elt_pointer pEVar4;
  
  this = inst();
  pEVar4 = (this->m_stack).c.
           super__Deque_base<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar4 == (this->m_stack).c.
                super__Deque_base<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pEVar4 = (this->m_stack).c.
             super__Deque_base<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar1 = (lVar1 - pEVar4[-1].start.__d.__r) / 1000000;
  pPVar2 = inst();
  if ((pPVar2->m_outputThreshold).__r <= lVar1 * 1000000) {
    poVar3 = std::operator<<((ostream *)&std::cout,"PEPRO ");
    poVar3 = std::operator<<(poVar3,pEVar4[-1].name);
    std::operator<<(poVar3,":\t");
    poVar3 = std::ostream::_M_insert<double>((double)lVar1 / 1000.0);
    poVar3 = std::operator<<(poVar3," (s)");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  (pEVar4[-1].mark)->popOnDestruction = false;
  std::deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>::
  pop_back((deque<pepro::impl::ProfileStack::Entry,_std::allocator<pepro::impl::ProfileStack::Entry>_>
            *)this);
  return;
}

Assistant:

static void pop ()
	{
		auto& stack = inst().m_stack;
		const auto& e = stack.top();
		const auto dur = std::chrono::duration_cast<std::chrono::milliseconds>(clock::now() - e.start);
		if (dur >= inst().m_outputThreshold)
			std::cout << "PEPRO " << e.name << ":\t" << dur.count() / 1.e3 << " (s)" << std::endl;
		e.mark->popOnDestruction = false;
		stack.pop();
	}